

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

ACT_TYPE __thiscall
despot::TagHistoryModePolicy::Action
          (TagHistoryModePolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  Floor *pFVar1;
  pointer pmVar2;
  _Base_ptr p_Var3;
  long lVar4;
  long lVar5;
  long lVar6;
  OBS_TYPE OVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  _Rb_tree_header *p_Var12;
  mapped_type *pmVar13;
  undefined8 uVar14;
  ACT_TYPE AVar15;
  _Base_ptr p_Var16;
  _Rb_tree_header *p_Var17;
  vector<int,_std::allocator<int>_> actions;
  Coord rob;
  OBS_TYPE obs;
  int local_8c;
  undefined1 local_88 [8];
  int *piStack_80;
  int *local_78;
  BaseTag *local_68 [2];
  long *local_58;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *local_50;
  pointer local_48 [2];
  pointer local_38;
  
  iVar10 = despot::RandomStreams::position();
  if (iVar10 == 0) {
    AVar15 = this->first_action_;
  }
  else {
    iVar10 = despot::RandomStreams::position();
    if (iVar10 == 1) {
      iVar10 = *(int *)(*(long *)(history + 8) + -4);
      local_68[0] = *(BaseTag **)(*(long *)(history + 0x20) + -8);
      pmVar2 = (this->paths_).
               super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var12 = &pmVar2[iVar10]._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = *(_Base_ptr *)((long)&pmVar2[iVar10]._M_t._M_impl.super__Rb_tree_header + 8);
      p_Var16 = &p_Var12->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[*(BaseTag **)(p_Var3 + 1) < local_68[0]]) {
        if (*(BaseTag **)(p_Var3 + 1) >= local_68[0]) {
          p_Var16 = p_Var3;
        }
      }
      p_Var17 = p_Var12;
      if (((_Rb_tree_header *)p_Var16 != p_Var12) &&
         (p_Var17 = (_Rb_tree_header *)p_Var16,
         local_68[0] < (BaseTag *)((_Rb_tree_header *)p_Var16)->_M_node_count)) {
        p_Var17 = p_Var12;
      }
      if (p_Var17 == p_Var12) {
        local_50 = particles;
        local_58 = (long *)(**(code **)(*(long *)this->tag_model_ + 0x108))
                                     (this->tag_model_,this->belief_);
        ComputeMode((TagHistoryModePolicy *)local_88,(Belief *)this);
        local_68[1]._4_4_ = piStack_80._4_4_;
        despot::Floor::NumCells();
        despot::Floor::NumCells();
        despot::Floor::ComputeShortestPath((int)local_48,(int)this + 0x30);
        pmVar13 = std::
                  map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[]((this->paths_).
                               super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + iVar10,
                               (key_type_conflict *)local_68);
        particles = local_50;
        std::vector<int,_std::allocator<int>_>::_M_move_assign(pmVar13,local_48);
        if (local_48[0] != (pointer)0x0) {
          operator_delete(local_48[0],(long)local_38 - (long)local_48[0]);
        }
        if (local_58 != (long *)0x0) {
          (**(code **)(*local_58 + 8))();
        }
        despot::State::~State((State *)local_88);
      }
    }
    lVar4 = *(long *)(history + 8);
    lVar5 = *(long *)history;
    iVar10 = despot::RandomStreams::position();
    lVar6 = *(long *)history;
    iVar10 = *(int *)(lVar6 + (long)((int)((ulong)(lVar4 - lVar5) >> 2) - iVar10) * 4);
    lVar4 = *(long *)(history + 8);
    iVar11 = despot::RandomStreams::position();
    local_48[0] = *(pointer *)
                   (*(long *)(history + 0x18) +
                   (long)((int)((ulong)(lVar4 - lVar6) >> 2) - iVar11) * 8);
    pmVar13 = std::
              map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[]((this->paths_).
                           super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar10,
                           (key_type_conflict *)local_48);
    iVar10 = despot::RandomStreams::position();
    if ((ulong)(long)(iVar10 + -1) <
        (ulong)((long)(pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2)) {
      iVar10 = despot::RandomStreams::position();
      AVar15 = (pmVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[(long)iVar10 + -1];
    }
    else {
      AVar15 = 4;
      if (*(OBS_TYPE *)(*(long *)(history + 0x20) + -8) != this->tag_model_->same_loc_obs_) {
        local_88 = (undefined1  [8])0x0;
        piStack_80 = (int *)0x0;
        local_78 = (int *)0x0;
        despot::Coord::Coord((Coord *)local_68);
        OVar7 = this->tag_model_->same_loc_obs_;
        pFVar1 = &this->floor_;
        iVar10 = despot::Floor::NumCells();
        if (OVar7 == (long)iVar10) {
          local_68[0] = (BaseTag *)despot::Floor::GetCell((int)pFVar1);
        }
        else {
          local_68[0] = (BaseTag *)BaseTag::MostLikelyRobPosition(this->tag_model_,particles);
        }
        local_8c = 0;
        do {
          cVar9 = despot::Compass::Opposite(local_8c,*(int *)(*(long *)(history + 8) + -4));
          if (cVar9 == '\0') {
            uVar14 = despot::operator+((Coord *)local_68,(Coord *)(&Compass::DIRECTIONS + local_8c))
            ;
            cVar9 = despot::Floor::Inside(pFVar1,uVar14);
            if (cVar9 != '\0') {
              if (piStack_80 == local_78) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_88,(iterator)piStack_80,
                           &local_8c);
              }
              else {
                *piStack_80 = local_8c;
                piStack_80 = piStack_80 + 1;
              }
            }
          }
          iVar10 = local_8c + 1;
          bVar8 = local_8c < 3;
          local_8c = iVar10;
        } while (bVar8);
        if ((undefined1  [8])piStack_80 == local_88) {
          local_8c = 0;
          do {
            uVar14 = despot::operator+((Coord *)local_68,(Coord *)(&Compass::DIRECTIONS + local_8c))
            ;
            cVar9 = despot::Floor::Inside(pFVar1,uVar14);
            if (cVar9 != '\0') {
              if (piStack_80 == local_78) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_88,(iterator)piStack_80,
                           &local_8c);
              }
              else {
                *piStack_80 = local_8c;
                piStack_80 = piStack_80 + 1;
              }
            }
            iVar10 = local_8c + 1;
            bVar8 = local_8c < 3;
            local_8c = iVar10;
          } while (bVar8);
        }
        if ((undefined1  [8])piStack_80 == local_88) {
          AVar15 = 0;
        }
        else {
          iVar10 = despot::Random::NextInt(0x121170);
          AVar15 = *(ACT_TYPE *)((long)local_88 + (long)iVar10 * 4);
        }
        if (local_88 != (undefined1  [8])0x0) {
          operator_delete((void *)local_88,(long)local_78 - (long)local_88);
        }
      }
    }
  }
  return AVar15;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles,
		RandomStreams& streams, History& history) const {
		if (streams.position() == 0)
		return first_action_;

		if (streams.position() == 1) {
			ACT_TYPE action = history.LastAction();
			OBS_TYPE obs = history.LastObservation();

			if (paths_[action].find(obs) == paths_[action].end()) {
				Belief* belief = tag_model_->Tau(belief_, action, obs);

				State mode = ComputeMode(belief);
				int rob = tag_model_->StateIndexToRobIndex(mode.state_id);
				int opp = tag_model_->StateIndexToOppIndex(mode.state_id);
				paths_[action][obs] = floor_.ComputeShortestPath(rob, opp);

				delete belief;
			}
		}

		ACT_TYPE action = history.Action(history.Size() - streams.position());
		OBS_TYPE obs = history.Observation(history.Size() - streams.position());
		const vector<int>& policy = paths_[action][obs];

		if (streams.position() - 1 < policy.size()) {
			return policy[streams.position() - 1];
		}

		if (history.LastObservation() == tag_model_->same_loc_obs_)
		return tag_model_->TagAction();

		vector<int> actions;
		// Compute rob position
		Coord rob;
		if (tag_model_->same_loc_obs_ != floor_.NumCells()) {
			rob = tag_model_->MostLikelyRobPosition(particles);
		} else {
			rob = floor_.GetCell(history.LastObservation());
		}

		// Don't double back and don't go into walls
		for (int d = 0; d < 4; d ++) {
			if (!Compass::Opposite(d, history.LastAction()) && floor_.Inside(rob + Compass::DIRECTIONS[d])) {
				actions.push_back(d);
			}
		}

		if (actions.size() == 0) {
			for (int d = 0; d < 4; d ++) {
				if (floor_.Inside(rob + Compass::DIRECTIONS[d]))
				actions.push_back(d);
			}
		}

		if (actions.size() == 0) // Rob may be trapped by the obstacles
		return 0;

		int act = actions[Random::RANDOM.NextInt(actions.size())];
		return act;
	}